

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O3

object_type * __thiscall
entt::basic_storage<entt::entity,Swarm,void>::construct<Swarm_const&>
          (basic_storage<entt::entity,Swarm,void> *this,entity_type entt,Swarm *args)

{
  iterator __position;
  Swarm local_14;
  
  __position._M_current = *(Swarm **)(this + 0x40);
  if (__position._M_current == *(Swarm **)(this + 0x48)) {
    std::vector<Swarm,_std::allocator<Swarm>_>::_M_realloc_insert<Swarm>
              ((vector<Swarm,_std::allocator<Swarm>_> *)(this + 0x38),__position,&local_14);
  }
  else {
    (__position._M_current)->value = args->value;
    *(Swarm **)(this + 0x40) = __position._M_current + 1;
  }
  sparse_set<entt::entity>::construct((sparse_set<entt::entity> *)this,entt);
  return (object_type *)(*(long *)(this + 0x40) + -4);
}

Assistant:

object_type & construct(const entity_type entt, Args &&... args) {
        if constexpr(std::is_aggregate_v<object_type>) {
            instances.emplace_back(Type{std::forward<Args>(args)...});
        } else {
            instances.emplace_back(std::forward<Args>(args)...);
        }

        // entity goes after component in case constructor throws
        underlying_type::construct(entt);
        return instances.back();
    }